

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

void __thiscall amrex::MultiFab::WeightedSync(MultiFab *this,MultiFab *wgt,Periodicity *period)

{
  BoxArray *bxs;
  int ncomp;
  IndexType IVar1;
  int iVar2;
  int dstcomp;
  MFInfo local_1d8;
  MultiFab tmpmf;
  
  bxs = &(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  IVar1 = BATransformer::index_type(&bxs->m_bat);
  if (IVar1.itype != 0) {
    ncomp = (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    dstcomp = 0;
    iVar2 = 0;
    if (0 < ncomp) {
      iVar2 = ncomp;
    }
    for (; iVar2 != dstcomp; dstcomp = dstcomp + 1) {
      Multiply(this,wgt,0,dstcomp,1,0);
    }
    local_1d8.alloc = true;
    local_1d8._1_7_ = 0;
    local_1d8.arena = (Arena *)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MultiFab(&tmpmf,bxs,&(this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap
             ,ncomp,0,&local_1d8,
             (this->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&tmpmf.super_FabArray<amrex::FArrayBox>,0.0);
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&tmpmf.super_FabArray<amrex::FArrayBox>,&this->super_FabArray<amrex::FArrayBox>,
               period,ADD);
    Copy(this,&tmpmf,0,0,ncomp,0);
    FabArray<amrex::FArrayBox>::~FabArray(&tmpmf.super_FabArray<amrex::FArrayBox>);
  }
  return;
}

Assistant:

void
MultiFab::WeightedSync (const MultiFab& wgt, const Periodicity& period)
{
    BL_PROFILE("MultiFab::WeightedSync()");

    if (ixType().cellCentered()) return;

    const int ncomp = nComp();
    for (int comp = 0; comp < ncomp; ++comp)
    {
        MultiFab::Multiply(*this, wgt, 0, comp, 1, 0);
    }

    MultiFab tmpmf(boxArray(), DistributionMap(), ncomp, 0, MFInfo(), Factory());
    tmpmf.setVal(Real(0.0));
    tmpmf.ParallelCopy(*this, period, FabArrayBase::ADD);

    MultiFab::Copy(*this, tmpmf, 0, 0, ncomp, 0);
}